

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle_settings.cpp
# Opt level: O0

ostream * cornelich::operator<<(ostream *os,vanilla_chronicle_settings *s)

{
  int32_t iVar1;
  ostream *poVar2;
  string *psVar3;
  int64_t iVar4;
  void *pvVar5;
  size_t sVar6;
  __type_conflict1 _Var7;
  vanilla_chronicle_settings *s_local;
  ostream *os_local;
  
  poVar2 = std::operator<<(os,"- path                   = ");
  psVar3 = vanilla_chronicle_settings::path_abi_cxx11_(s);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(poVar2,"- cycle_length           = ");
  iVar1 = vanilla_chronicle_settings::cycle_length(s);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(poVar2,"- entries_per_cycle      = ");
  iVar4 = vanilla_chronicle_settings::entries_per_cycle(s);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
  poVar2 = std::operator<<(poVar2," [");
  iVar4 = vanilla_chronicle_settings::entries_per_cycle(s);
  _Var7 = std::log2<long>(iVar4);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_Var7);
  poVar2 = std::operator<<(poVar2," bits]\n");
  poVar2 = std::operator<<(poVar2,"- index_block_size       = ");
  iVar4 = vanilla_chronicle_settings::index_block_size(s);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
  poVar2 = std::operator<<(poVar2," [");
  iVar4 = vanilla_chronicle_settings::index_block_size(s);
  _Var7 = std::log2<long>(iVar4);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_Var7);
  poVar2 = std::operator<<(poVar2," bits]\n");
  poVar2 = std::operator<<(poVar2,"- data_block_size        = ");
  iVar4 = vanilla_chronicle_settings::data_block_size(s);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
  poVar2 = std::operator<<(poVar2," [");
  iVar4 = vanilla_chronicle_settings::data_block_size(s);
  _Var7 = std::log2<long>(iVar4);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_Var7);
  poVar2 = std::operator<<(poVar2," bits]\n");
  poVar2 = std::operator<<(poVar2,"- thread_id_bits         = ");
  iVar1 = vanilla_chronicle_settings::thread_id_bits(s);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(poVar2,"- thread_id_mask         = 0x");
  pvVar5 = (void *)std::ostream::operator<<(poVar2,std::hex);
  iVar4 = vanilla_chronicle_settings::thread_id_mask(s);
  pvVar5 = (void *)std::ostream::operator<<(pvVar5,iVar4);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
  poVar2 = std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(poVar2,"- index_data_offset_bits = ");
  iVar1 = vanilla_chronicle_settings::index_data_offset_bits(s);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(poVar2,"- index_data_offset_mask = 0x");
  pvVar5 = (void *)std::ostream::operator<<(poVar2,std::hex);
  iVar4 = vanilla_chronicle_settings::index_data_offset_mask(s);
  pvVar5 = (void *)std::ostream::operator<<(pvVar5,iVar4);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
  poVar2 = std::operator<<(poVar2,"- index_cache_size       = ");
  sVar6 = vanilla_chronicle_settings::index_cache_size(s);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar6);
  poVar2 = std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(poVar2,"- data_cache_size        = ");
  sVar6 = vanilla_chronicle_settings::data_cache_size(s);
  std::ostream::operator<<(poVar2,sVar6);
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const vanilla_chronicle_settings & s)
{
    os << "- path                   = " << s.path() << '\n'
       << "- cycle_length           = " << s.cycle_length() << '\n'
       << "- entries_per_cycle      = " << s.entries_per_cycle() << " [" << std::log2(s.entries_per_cycle()) << " bits]\n"
       << "- index_block_size       = " << s.index_block_size() << " [" << std::log2(s.index_block_size()) << " bits]\n"
       << "- data_block_size        = " << s.data_block_size() << " [" << std::log2(s.data_block_size()) << " bits]\n"
       << "- thread_id_bits         = " << s.thread_id_bits() << '\n'
       << "- thread_id_mask         = 0x" << std::hex << s.thread_id_mask() << std::dec << '\n'
       << "- index_data_offset_bits = " << s.index_data_offset_bits() << '\n'
       << "- index_data_offset_mask = 0x" << std::hex << s.index_data_offset_mask() << std::dec
       << "- index_cache_size       = " << s.index_cache_size() << '\n'
       << "- data_cache_size        = " << s.data_cache_size();
    return os;
}